

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Scroll.cxx
# Opt level: O2

void __thiscall Fl_Scroll::recalc_scrollbars(Fl_Scroll *this,ScrollInfo *si)

{
  undefined4 uVar1;
  undefined4 uVar2;
  byte bVar3;
  uint uVar4;
  Fl_Widget *pFVar5;
  int iVar6;
  uint uVar7;
  Fl_Widget **ppFVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  bool bVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  bool bVar16;
  
  iVar9 = (this->super_Fl_Group).super_Fl_Widget.x_;
  iVar6 = Fl::box_dx((uint)(this->super_Fl_Group).super_Fl_Widget.box_);
  (si->innerbox).x = iVar6 + iVar9;
  iVar9 = (this->super_Fl_Group).super_Fl_Widget.y_;
  iVar6 = Fl::box_dy((uint)(this->super_Fl_Group).super_Fl_Widget.box_);
  (si->innerbox).y = iVar6 + iVar9;
  iVar9 = (this->super_Fl_Group).super_Fl_Widget.w_;
  iVar6 = Fl::box_dw((uint)(this->super_Fl_Group).super_Fl_Widget.box_);
  (si->innerbox).w = iVar9 - iVar6;
  iVar9 = (this->super_Fl_Group).super_Fl_Widget.h_;
  iVar6 = Fl::box_dh((uint)(this->super_Fl_Group).super_Fl_Widget.box_);
  (si->innerbox).h = iVar9 - iVar6;
  uVar1 = (si->innerbox).x;
  uVar2 = (si->innerbox).y;
  (si->child).l = uVar1;
  (si->child).r = uVar1;
  (si->child).t = uVar2;
  (si->child).b = uVar2;
  ppFVar8 = Fl_Group::array(&this->super_Fl_Group);
  iVar9 = (this->super_Fl_Group).children_;
  iVar6 = (si->child).r;
  iVar14 = (si->child).t;
  bVar12 = false;
  iVar15 = (si->child).l;
  iVar11 = (si->child).b;
  while (bVar16 = iVar9 != 0, iVar9 = iVar9 + -1, bVar16) {
    pFVar5 = *ppFVar8;
    ppFVar8 = ppFVar8 + 1;
    if ((Fl_Scrollbar *)pFVar5 != &this->hscrollbar && (Fl_Scrollbar *)pFVar5 != &this->scrollbar) {
      iVar10 = pFVar5->x_;
      if (bVar12) {
        if (iVar10 < iVar15) {
          (si->child).l = iVar10;
          iVar15 = iVar10;
        }
        iVar13 = pFVar5->y_;
        if (iVar13 < iVar14) {
          (si->child).t = iVar13;
          iVar14 = iVar13;
        }
        iVar10 = iVar10 + pFVar5->w_;
        if (iVar6 < iVar10) {
          (si->child).r = iVar10;
          iVar6 = iVar10;
        }
        iVar13 = iVar13 + pFVar5->h_;
        bVar12 = true;
        if (iVar11 < iVar13) {
          (si->child).b = iVar13;
          bVar12 = true;
          iVar11 = iVar13;
        }
      }
      else {
        (si->child).l = iVar10;
        iVar6 = pFVar5->w_ + iVar10;
        (si->child).r = iVar6;
        iVar14 = pFVar5->y_;
        iVar11 = pFVar5->h_ + iVar14;
        (si->child).b = iVar11;
        (si->child).t = iVar14;
        bVar12 = true;
        iVar15 = iVar10;
      }
    }
  }
  iVar9 = (si->innerbox).x;
  iVar6 = (si->innerbox).y;
  iVar14 = (si->innerbox).w;
  iVar15 = (si->innerbox).h;
  uVar7 = this->scrollbar_size_;
  if (uVar7 == 0) {
    uVar7 = Fl::scrollbar_size();
  }
  si->scrollsize = uVar7;
  si->hneeded = 0;
  si->vneeded = 0;
  bVar3 = (this->super_Fl_Group).super_Fl_Widget.type_;
  bVar12 = true;
  if (((bVar3 & 2) != 0) &&
     ((((bVar3 & 4) != 0 || ((si->child).t < iVar6)) || (iVar15 + iVar6 < (si->child).b)))) {
    si->vneeded = 1;
    iVar14 = iVar14 - uVar7;
    iVar9 = iVar9 + ((int)((this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.
                           label_.align_ << 0x1d) >> 0x1f & uVar7);
    bVar12 = false;
  }
  if (((bVar3 & 1) != 0) &&
     ((((bVar3 & 4) != 0 || ((si->child).l < iVar9)) || (iVar9 + iVar14 < (si->child).r)))) {
    si->hneeded = 1;
    iVar15 = iVar15 - uVar7;
    uVar4 = (this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.label_.align_;
    iVar6 = (-(uVar4 & 1) & uVar7) + iVar6;
    if (((bVar12) && ((bVar3 & 2) != 0)) &&
       (((bVar3 & 4) != 0 || (((si->child).t < iVar6 || (iVar6 + iVar15 < (si->child).b)))))) {
      si->vneeded = 1;
      iVar14 = iVar14 - uVar7;
      iVar9 = iVar9 + ((int)(uVar4 << 0x1d) >> 0x1f & uVar7);
    }
  }
  (si->innerchild).x = iVar9;
  (si->innerchild).y = iVar6;
  (si->innerchild).w = iVar14;
  (si->innerchild).h = iVar15;
  (si->hscroll).x = iVar9;
  iVar11 = (si->innerbox).y;
  uVar4 = (this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.label_.align_;
  iVar10 = (iVar11 - uVar7) + (si->innerbox).h;
  if ((uVar4 & 1) != 0) {
    iVar10 = iVar11;
  }
  iVar11 = (si->innerbox).x;
  (si->hscroll).y = iVar10;
  (si->hscroll).w = iVar14;
  (si->hscroll).h = uVar7;
  iVar10 = (iVar11 - uVar7) + (si->innerbox).w;
  if ((uVar4 & 4) != 0) {
    iVar10 = iVar11;
  }
  (si->vscroll).x = iVar10;
  (si->vscroll).y = iVar6;
  (si->vscroll).w = uVar7;
  (si->vscroll).h = iVar15;
  iVar11 = (si->child).l;
  (si->hscroll).pos = iVar9 - iVar11;
  (si->hscroll).size = iVar14;
  (si->hscroll).first = 0;
  iVar14 = (si->child).r - iVar11;
  iVar9 = iVar9 - iVar11;
  (si->hscroll).total = iVar14;
  if (iVar9 < 0) {
    (si->hscroll).total = iVar14 - iVar9;
    (si->hscroll).first = iVar9;
  }
  (si->vscroll).first = 0;
  iVar9 = (si->child).t;
  iVar14 = (si->child).b - iVar9;
  iVar6 = iVar6 - iVar9;
  (si->vscroll).pos = iVar6;
  (si->vscroll).size = iVar15;
  (si->vscroll).total = iVar14;
  if (iVar6 < 0) {
    (si->vscroll).total = iVar14 - iVar6;
    (si->vscroll).first = iVar6;
  }
  return;
}

Assistant:

void Fl_Scroll::recalc_scrollbars(ScrollInfo &si) {

  // inner box of widget (excluding scrollbars)
  si.innerbox.x = x()+Fl::box_dx(box());
  si.innerbox.y = y()+Fl::box_dy(box());
  si.innerbox.w = w()-Fl::box_dw(box());
  si.innerbox.h = h()-Fl::box_dh(box());

  // accumulate a bounding box for all the children
  si.child.l = si.innerbox.x;
  si.child.r = si.innerbox.x;
  si.child.b = si.innerbox.y;
  si.child.t = si.innerbox.y;
  int first = 1;
  Fl_Widget*const* a = array();
  for (int i=children(); i--;) {
    Fl_Widget* o = *a++;
    if ( o==&scrollbar || o==&hscrollbar ) continue;
    if ( first ) {
        first = 0;
	si.child.l = o->x();
	si.child.r = o->x()+o->w();
	si.child.b = o->y()+o->h();
	si.child.t = o->y();
    } else {
	if (o->x() < si.child.l) si.child.l = o->x();
	if (o->y() < si.child.t) si.child.t = o->y();
	if (o->x()+o->w() > si.child.r) si.child.r = o->x()+o->w();
	if (o->y()+o->h() > si.child.b) si.child.b = o->y()+o->h();
    }
  }

  // Turn the scrollbars on and off as necessary.
  // See if children would fit if we had no scrollbars...
  {
    int X = si.innerbox.x;
    int Y = si.innerbox.y;
    int W = si.innerbox.w;
    int H = si.innerbox.h;

    si.scrollsize = scrollbar_size_ ? scrollbar_size_ : Fl::scrollbar_size();
    si.vneeded = 0;
    si.hneeded = 0;
    if (type() & VERTICAL) {
      if ((type() & ALWAYS_ON) || si.child.t < Y || si.child.b > Y+H) {
	si.vneeded = 1;
	W -= si.scrollsize;
	if (scrollbar.align() & FL_ALIGN_LEFT) X += si.scrollsize;
      }
    }
    if (type() & HORIZONTAL) {
      if ((type() & ALWAYS_ON) || si.child.l < X || si.child.r > X+W) {
	si.hneeded = 1;
	H -= si.scrollsize;
	if (scrollbar.align() & FL_ALIGN_TOP) Y += si.scrollsize;
	// recheck vertical since we added a horizontal scrollbar
	if (!si.vneeded && (type() & VERTICAL)) {
	  if ((type() & ALWAYS_ON) || si.child.t < Y || si.child.b > Y+H) {
	    si.vneeded = 1;
	    W -= si.scrollsize;
	    if (scrollbar.align() & FL_ALIGN_LEFT) X += si.scrollsize;
	  }
	}
      }
    }
    si.innerchild.x = X;
    si.innerchild.y = Y;
    si.innerchild.w = W;
    si.innerchild.h = H;
  }

  // calculate hor scrollbar position
  si.hscroll.x = si.innerchild.x;
  si.hscroll.y = (scrollbar.align() & FL_ALIGN_TOP)
		     ? si.innerbox.y
		     : si.innerbox.y + si.innerbox.h - si.scrollsize;
  si.hscroll.w = si.innerchild.w;
  si.hscroll.h = si.scrollsize;

  // calculate ver scrollbar position
  si.vscroll.x = (scrollbar.align() & FL_ALIGN_LEFT)
                     ? si.innerbox.x
		     : si.innerbox.x + si.innerbox.w - si.scrollsize;
  si.vscroll.y = si.innerchild.y;
  si.vscroll.w = si.scrollsize;
  si.vscroll.h = si.innerchild.h;

  // calculate h/v scrollbar values (pos/size/first/total)
  si.hscroll.pos = si.innerchild.x - si.child.l;
  si.hscroll.size = si.innerchild.w;
  si.hscroll.first = 0;
  si.hscroll.total = si.child.r - si.child.l;
  if ( si.hscroll.pos < 0 ) { si.hscroll.total += (-si.hscroll.pos); si.hscroll.first = si.hscroll.pos; }

  si.vscroll.pos = si.innerchild.y - si.child.t;
  si.vscroll.size = si.innerchild.h;
  si.vscroll.first = 0;
  si.vscroll.total = si.child.b - si.child.t;
  if ( si.vscroll.pos < 0 ) { si.vscroll.total += (-si.vscroll.pos); si.vscroll.first = si.vscroll.pos; }

//  printf("DEBUG --- ScrollInfo ---\n");
//  printf("DEBUG        scrollsize: %d\n", si.scrollsize);
//  printf("DEBUG  hneeded, vneeded: %d %d\n", si.hneeded, si.vneeded);
//  printf("DEBUG     innerbox.x, si.innerbox.y, si.innerbox.w,si.innerbox.h);
//  printf("DEBUG   innerchild.xywh: %d %d %d %d\n", si.innerchild.x, si.innerchild.y, si.innerchild.w, si.innerchild.h);
//  printf("DEBUG        child lrbt: %d %d %d %d\n", si.child.l, si.child.r, si.child.b, si.child.t);
//  printf("DEBUG      hscroll xywh: %d %d %d %d\n", si.hscroll.x, si.hscroll.y, si.hscroll.w, si.hscroll.h);
//  printf("DEBUG      vscroll xywh: %d %d %d %d\n", si.vscroll.x, si.vscroll.y, si.vscroll.w, si.vscroll.h);
//  printf("DEBUG  horz scroll vals: %d %d %d %d\n", si.hscroll.pos, si.hscroll.size, si.hscroll.first, si.hscroll.total);
//  printf("DEBUG  vert scroll vals: %d %d %d %d\n", si.vscroll.pos, si.vscroll.size, si.vscroll.first, si.vscroll.total);
//  printf("DEBUG \n");
}